

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.cpp
# Opt level: O2

string * __thiscall
ScrollPanel::writeXml_abi_cxx11_(string *__return_storage_ptr__,ScrollPanel *this,int indent)

{
  int indent_00;
  ostream *poVar1;
  int level;
  int level_00;
  stringstream str;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  string local_250;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  Util::getIndent_abi_cxx11_(&local_2f0,(Util *)(ulong)(uint)indent,level);
  poVar1 = std::operator<<(local_1a0,(string *)&local_2f0);
  std::operator<<(poVar1,"<ScrollPanel");
  std::__cxx11::string::~string((string *)&local_2f0);
  Widget::writeXmlAttributes(&this->super_Widget,(stringstream *)local_1b0);
  poVar1 = std::operator<<(local_1a0,">");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::__cxx11::string::string((string *)&local_1d0,"PanelX",(allocator *)&local_2f0);
  indent_00 = indent + 1;
  Util::writeXmlElement<float>((stringstream *)local_1b0,indent_00,&local_1d0,this->panelX);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::string((string *)&local_1f0,"PanelY",(allocator *)&local_2f0);
  Util::writeXmlElement<float>((stringstream *)local_1b0,indent_00,&local_1f0,this->panelY);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::string((string *)&local_210,"PanelWidth",(allocator *)&local_2f0);
  Util::writeXmlElement<float>((stringstream *)local_1b0,indent_00,&local_210,this->panelWidth);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::string((string *)&local_230,"PanelHeight",(allocator *)&local_2f0);
  Util::writeXmlElement<float>((stringstream *)local_1b0,indent_00,&local_230,this->panelHeight);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::string((string *)&local_250,"PanelName",(allocator *)&local_2f0);
  std::__cxx11::string::string((string *)&local_270,(string *)&this->panelName);
  Util::writeXmlElement<std::__cxx11::string>
            ((stringstream *)local_1b0,indent_00,&local_250,&local_270);
  std::__cxx11::string::~string((string *)&local_270);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::string((string *)&local_290,"HorizontalScroll",(allocator *)&local_2f0);
  Util::writeXmlElement<bool>((stringstream *)local_1b0,indent_00,&local_290,this->horizontalScroll)
  ;
  std::__cxx11::string::~string((string *)&local_290);
  std::__cxx11::string::string((string *)&local_2b0,"VerticalScroll",(allocator *)&local_2f0);
  Util::writeXmlElement<bool>((stringstream *)local_1b0,indent_00,&local_2b0,this->verticalScroll);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::__cxx11::string::string((string *)&local_2d0,"ScrollBarVisibility",(allocator *)&local_2f0);
  Util::writeXmlElement<ScrollBarVisibility>
            ((stringstream *)local_1b0,indent_00,&local_2d0,this->scrollBarVisibility);
  std::__cxx11::string::~string((string *)&local_2d0);
  Widget::writeXmlChildren(&this->super_Widget,(stringstream *)local_1b0,indent_00);
  Util::getIndent_abi_cxx11_(&local_2f0,(Util *)(ulong)(uint)indent,level_00);
  poVar1 = std::operator<<(local_1a0,(string *)&local_2f0);
  std::operator<<(poVar1,"</ScrollPanel>");
  std::__cxx11::string::~string((string *)&local_2f0);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  return __return_storage_ptr__;
}

Assistant:

std::string ScrollPanel::writeXml(int indent)
{
	std::stringstream str;
	str << Util::getIndent(indent) << "<ScrollPanel";
	writeXmlAttributes(str);
	str << ">" << std::endl;

	Util::writeXmlElement(str, indent + 1, "PanelX", panelX);
	Util::writeXmlElement(str, indent + 1, "PanelY", panelY);
	Util::writeXmlElement(str, indent + 1, "PanelWidth", panelWidth);
	Util::writeXmlElement(str, indent + 1, "PanelHeight", panelHeight);
	Util::writeXmlElement(str, indent + 1, "PanelName", panelName);
	Util::writeXmlElement(str, indent + 1, "HorizontalScroll", horizontalScroll);
	Util::writeXmlElement(str, indent + 1, "VerticalScroll", verticalScroll);
	Util::writeXmlElement(str, indent + 1, "ScrollBarVisibility", scrollBarVisibility);

	writeXmlChildren(str, indent + 1);

	str << Util::getIndent(indent) << "</ScrollPanel>";
	return str.str();
}